

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BestLiteralSelector.hpp
# Opt level: O3

void __thiscall
Kernel::
CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
::fillMaximals(CompleteBestLiteralSelector<Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::ColoredFirst,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::NegativeEquality,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::MaximalSize,_Kernel::LiteralComparators::Composite<Kernel::LiteralComparators::Negative,_Kernel::LiteralComparators::LexComparator>_>_>_>_>
               *this,LiteralList **maximals,DArray<Kernel::Literal_*> *litArr)

{
  Literal **ppLVar1;
  Literal *pLVar2;
  LiteralList *pLVar3;
  LiteralList *pLVar4;
  long lVar5;
  
  if (litArr->_size != 0) {
    ppLVar1 = litArr->_array;
    lVar5 = litArr->_size << 3;
    pLVar4 = *maximals;
    do {
      pLVar2 = *(Literal **)((long)ppLVar1 + lVar5 + -8);
      pLVar3 = (LiteralList *)
               Lib::FixedSizeAllocator<16UL>::alloc
                         ((FixedSizeAllocator<16UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
      pLVar3->_head = pLVar2;
      pLVar3->_tail = pLVar4;
      *maximals = pLVar3;
      lVar5 = lVar5 + -8;
      pLVar4 = pLVar3;
    } while (lVar5 != 0);
  }
  Ordering::removeNonMaximal((this->super_LiteralSelector)._ord,maximals);
  return;
}

Assistant:

void fillMaximals(LiteralList*& maximals, DArray<Literal*>& litArr)
  {
    DArray<Literal*>::ReversedIterator rlit(litArr);
    while(rlit.hasNext()) {
      Literal* lit=rlit.next();
      LiteralList::push(lit,maximals);
    }
    _ord.removeNonMaximal(maximals);
  }